

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O1

bool __thiscall SessionManager::haveSession(SessionManager *this,CK_SLOT_ID slotID)

{
  Slot *this_00;
  CK_SLOT_ID CVar1;
  pointer ppSVar2;
  bool bVar3;
  MutexLocker lock;
  MutexLocker local_30;
  
  MutexLocker::MutexLocker(&local_30,this->sessionsMutex);
  for (ppSVar2 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      bVar3 = ppSVar2 !=
              (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
              super__Vector_impl_data._M_finish, bVar3; ppSVar2 = ppSVar2 + 1) {
    if (*ppSVar2 != (Session *)0x0) {
      this_00 = Session::getSlot(*ppSVar2);
      CVar1 = Slot::getSlotID(this_00);
      if (CVar1 == slotID) break;
    }
  }
  MutexLocker::~MutexLocker(&local_30);
  return bVar3;
}

Assistant:

bool SessionManager::haveSession(CK_SLOT_ID slotID)
{
	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	for (std::vector<Session*>::iterator i = sessions.begin(); i != sessions.end(); i++)
	{
		if (*i == NULL) continue;

		if ((*i)->getSlot()->getSlotID() == slotID)
		{
			return true;
		}
	}

	return false;
}